

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O3

UBool uhash_compareIChars_63(UHashTok key1,UHashTok key2)

{
  char cVar1;
  char cVar2;
  char *p2;
  char *p1;
  char *pcVar3;
  bool bVar4;
  
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (key2.pointer == (void *)0x0 || key1.pointer == (void *)0x0) {
    bVar4 = false;
  }
  else {
    cVar1 = *key1.pointer;
    if (cVar1 != '\0') {
      pcVar3 = (char *)((long)key1.pointer + 1);
      do {
        cVar1 = uprv_asciitolower_63(cVar1);
        cVar2 = uprv_asciitolower_63(*key2.pointer);
        if (cVar1 != cVar2) {
          cVar1 = pcVar3[-1];
          goto LAB_002b5018;
        }
        key2.pointer = key2.pointer + 1;
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 != '\0');
    }
    cVar1 = '\0';
LAB_002b5018:
    bVar4 = cVar1 == *key2.pointer;
  }
  return bVar4;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareIChars(const UHashTok key1, const UHashTok key2) {
    const char *p1 = (const char*) key1.pointer;
    const char *p2 = (const char*) key2.pointer;
    if (p1 == p2) {
        return TRUE;
    }
    if (p1 == NULL || p2 == NULL) {
        return FALSE;
    }
    while (*p1 != 0 && uprv_tolower(*p1) == uprv_tolower(*p2)) {
        ++p1;
        ++p2;
    }
    return (UBool)(*p1 == *p2);
}